

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetLatestDataFromThreadSBGx(SBG *pSBG,SBGDATA *pSBGData)

{
  int iVar1;
  CRITICAL_SECTION *__mutex;
  long lVar2;
  SBGDATA *__src;
  
  __mutex = SBGCS;
  __src = sbgdataSBG;
  lVar2 = 0;
  do {
    if ((SBG *)addrsSBG[lVar2] == pSBG) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      memcpy(pSBGData,__src,0x11b0);
      iVar1 = resSBG[lVar2];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar2 = lVar2 + 1;
    __mutex = __mutex + 1;
    __src = __src + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadSBGx(SBG* pSBG, SBGDATA* pSBGData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&SBGCS[id]);
	*pSBGData = sbgdataSBG[id];
	res = resSBG[id];
	LeaveCriticalSection(&SBGCS[id]);

	return res;
}